

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cpp
# Opt level: O1

void __thiscall clickhouse::Block::Block(Block *this,size_t cols,size_t rows)

{
  (this->info_).is_overflows = '\0';
  (this->info_).bucket_num = -1;
  (this->columns_).
  super__Vector_base<clickhouse::Block::ColumnItem,_std::allocator<clickhouse::Block::ColumnItem>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->columns_).
  super__Vector_base<clickhouse::Block::ColumnItem,_std::allocator<clickhouse::Block::ColumnItem>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->columns_).
  super__Vector_base<clickhouse::Block::ColumnItem,_std::allocator<clickhouse::Block::ColumnItem>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->rows_ = rows;
  std::vector<clickhouse::Block::ColumnItem,_std::allocator<clickhouse::Block::ColumnItem>_>::
  reserve(&this->columns_,cols);
  return;
}

Assistant:

Block::Iterator::Iterator(const Block& block)
    : block_(block)
    , idx_(0)
{
}